

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

int greatest_string_printf_cb(void *t,void *udata)

{
  int iVar1;
  void *udata_local;
  void *t_local;
  
  iVar1 = fprintf(_stdout,"%s",t);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}